

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O1

double Omega_h::get_min<double>(Read<double> *a)

{
  int *piVar1;
  ulong uVar2;
  double dVar3;
  type transform;
  Alloc *local_20;
  
  local_20 = (a->write_).shared_alloc_.alloc;
  if (((ulong)local_20 & 1) == 0) {
    uVar2 = local_20->size;
  }
  else {
    uVar2 = (ulong)local_20 >> 3;
  }
  if (((ulong)local_20 & 7) == 0 && local_20 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_20 = (Alloc *)(local_20->size * 8 + 1);
    }
    else {
      local_20->use_count = local_20->use_count + 1;
    }
  }
  dVar3 = transform_reduce<Omega_h::IntIterator,Omega_h::get_min<double>(Omega_h::Read<double>)::_lambda(int)_1_,double,Omega_h::minimum<double>>
                    (0,uVar2 >> 3);
  if (((ulong)local_20 & 7) == 0 && local_20 != (Alloc *)0x0) {
    piVar1 = &local_20->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_20);
      operator_delete(local_20,0x48);
    }
  }
  return dVar3;
}

Assistant:

Write<T> divide_each(Read<T> a, Read<T> b, std::string const& name) {
  auto width = divide_no_remainder(a.size(), b.size());
  Write<T> c(a.size(), name);
  auto f = OMEGA_H_LAMBDA(LO i) {
    for (Int j = 0; j < width; ++j) {
      c[i * width + j] = a[i * width + j] / b[i];
    }
  };
  parallel_for(b.size(), f, "divide_each");
  return c;
}